

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

bool __thiscall IR::Int64ConstOpnd::IsEqualInternal(Int64ConstOpnd *this,Opnd *opnd)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Int64ConstOpnd *pIVar5;
  
  if ((this->super_Opnd).m_kind != OpndKindInt64Const) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x659,"(m_kind == OpndKindInt64Const)","m_kind == OpndKindInt64Const");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if ((opnd->m_kind == OpndKindInt64Const) && ((this->super_Opnd).m_type == opnd->m_type)) {
    lVar1 = (this->super_EncodableOpnd<long>).m_value;
    pIVar5 = Opnd::AsInt64ConstOpnd(opnd);
    bVar3 = lVar1 == (pIVar5->super_EncodableOpnd<long>).m_value;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Int64ConstOpnd::IsEqualInternal(Opnd *opnd)
{
    Assert(m_kind == OpndKindInt64Const);
    if (!opnd->IsInt64ConstOpnd() || this->GetType() != opnd->GetType())
    {
        return false;
    }

    return m_value == opnd->AsInt64ConstOpnd()->m_value;
}